

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O0

void anon_unknown.dwarf_714a8::AssertUint128Fails(char *s)

{
  bool bVar1;
  size_t sVar2;
  Message *message;
  char *message_00;
  AssertHelper local_48;
  Message local_40;
  Result local_38;
  Enum local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  v128 actual;
  char *s_local;
  
  local_34 = Error;
  actual.v._8_8_ = s;
  sVar2 = strlen(s);
  local_38 = wabt::ParseUint128(s,s + sVar2,(v128 *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<wabt::Result::Enum,_wabt::Result,_nullptr>
            ((EqHelper *)local_30,"Result::Error","ParseUint128(s, s + strlen(s), &actual)",
             &local_34,&local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    message = testing::Message::operator<<(&local_40,(char **)(actual.v + 8));
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-literal.cc"
               ,0x9b,message_00);
    testing::internal::AssertHelper::operator=(&local_48,message);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

void AssertUint128Fails(const char* s) {
  v128 actual;
  ASSERT_EQ(Result::Error, ParseUint128(s, s + strlen(s), &actual)) << s;
}